

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowExampleAppPropertyEditor(bool *p_open)

{
  bool bVar1;
  int obj_i;
  ImVec2 *in_stack_00000008;
  ImGuiStyleVar in_stack_00000014;
  ImGuiWindowFlags in_stack_000003f4;
  bool *in_stack_000003f8;
  char *in_stack_00000400;
  float in_stack_ffffffffffffffdc;
  int uid;
  ImVec2 in_stack_ffffffffffffffe0;
  float in_stack_ffffffffffffffe8;
  float in_stack_ffffffffffffffec;
  float in_stack_fffffffffffffff0;
  float in_stack_fffffffffffffff4;
  
  ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffff0,430.0,450.0);
  ImGui::SetNextWindowSize((ImVec2 *)&stack0xfffffffffffffff0,4);
  bVar1 = ImGui::Begin(in_stack_00000400,in_stack_000003f8,in_stack_000003f4);
  if (bVar1) {
    HelpMarker((char *)0x17698f);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffe8,2.0,2.0);
    ImGui::PushStyleVar(in_stack_00000014,in_stack_00000008);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffe0,0.0,0.0);
    bVar1 = ImGui::BeginTable((char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                              (int)in_stack_ffffffffffffffec,
                              (ImGuiTableFlags)in_stack_ffffffffffffffe8,
                              (ImVec2 *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    if (bVar1) {
      for (uid = 0; uid < 4; uid = uid + 1) {
        ShowPlaceholderObject((char *)in_stack_ffffffffffffffe0,uid);
      }
      ImGui::EndTable();
    }
    ImGui::PopStyleVar((int)in_stack_fffffffffffffff4);
    ImGui::End();
  }
  else {
    ImGui::End();
  }
  return;
}

Assistant:

static void ShowExampleAppPropertyEditor(bool* p_open)
{
    ImGui::SetNextWindowSize(ImVec2(430, 450), ImGuiCond_FirstUseEver);
    if (!ImGui::Begin("Example: Property editor", p_open))
    {
        ImGui::End();
        return;
    }

    HelpMarker(
        "This example shows how you may implement a property editor using two columns.\n"
        "All objects/fields data are dummies here.\n"
        "Remember that in many simple cases, you can use ImGui::SameLine(xxx) to position\n"
        "your cursor horizontally instead of using the Columns() API.");

    ImGui::PushStyleVar(ImGuiStyleVar_FramePadding, ImVec2(2, 2));
    if (ImGui::BeginTable("split", 2, ImGuiTableFlags_BordersOuter | ImGuiTableFlags_Resizable))
    {
        // Iterate placeholder objects (all the same data)
        for (int obj_i = 0; obj_i < 4; obj_i++)
        {
            ShowPlaceholderObject("Object", obj_i);
            //ImGui::Separator();
        }
        ImGui::EndTable();
    }
    ImGui::PopStyleVar();
    ImGui::End();
}